

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleGlyphsDrawingContext.cpp
# Opt level: O1

void __thiscall
SimpleGlyphsDrawingContext::Flush(SimpleGlyphsDrawingContext *this,bool inComputeAdvance)

{
  GlyphUnicodeMappingList *this_00;
  ushort uVar1;
  _List_node_base *p_Var2;
  PDFUsedFont *this_01;
  _List_node_base *p_Var3;
  double dVar4;
  UIntList local_48;
  
  if ((this->mText).super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>.
      _M_impl._M_node._M_size == 0) {
    if (inComputeAdvance) {
      this->mLatestAdvance = 0.0;
    }
  }
  else {
    this_00 = &this->mText;
    AbstractContentContext::SetupColor(this->mContentContext,&this->mOptions);
    AbstractContentContext::BT(this->mContentContext);
    AbstractContentContext::Tm(this->mContentContext,1.0,0.0,0.0,1.0,this->mX,this->mY);
    AbstractContentContext::SetCurrentFontSize(this->mContentContext,(this->mOptions).fontSize);
    AbstractContentContext::Tj(this->mContentContext,this_00);
    AbstractContentContext::ET(this->mContentContext);
    if (inComputeAdvance) {
      local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node._M_size
           = 0;
      local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_prev = (_List_node_base *)&local_48;
      local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)&local_48;
      for (p_Var3 = (this_00->
                    super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>).
                    _M_impl._M_node.super__List_node_base._M_next;
          p_Var3 != (_List_node_base *)this_00; p_Var3 = p_Var3->_M_next) {
        uVar1 = *(ushort *)&p_Var3[2]._M_prev;
        p_Var2 = (_List_node_base *)operator_new(0x18);
        *(uint *)&p_Var2[1]._M_next = (uint)uVar1;
        std::__detail::_List_node_base::_M_hook(p_Var2);
        local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
        _M_size = local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  _M_node._M_size + 1;
      }
      this_01 = AbstractContentContext::GetCurrentFont(this->mContentContext);
      dVar4 = PDFUsedFont::CalculateTextAdvance(this_01,&local_48,(this->mOptions).fontSize);
      this->mLatestAdvance = dVar4;
      p_Var3 = local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               _M_node.super__List_node_base._M_next;
      if (local_48.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl._M_node.
          super__List_node_base._M_next != (_List_node_base *)&local_48) {
        do {
          p_Var2 = p_Var3->_M_next;
          operator_delete(p_Var3,0x18);
          p_Var3 = p_Var2;
        } while (p_Var2 != (_List_node_base *)&local_48);
      }
    }
    std::__cxx11::_List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::_M_clear
              (&this_00->super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>
              );
    (this->mText).super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
    (this->mText).super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
    (this->mText).super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>.
    _M_impl._M_node._M_size = 0;
  }
  return;
}

Assistant:

void SimpleGlyphsDrawingContext::Flush(bool inComputeAdvance) {
	// current font is expected to have been set in advance, so don't bother with it, and can
	// grab current font

	if(mText.size() == 0) {
		if(inComputeAdvance) {
			mLatestAdvance = 0;
		}
		return;
	}

    mContentContext->SetupColor(mOptions);
	mContentContext->BT();
	mContentContext->Tm(1,0,0,1,mX,mY);
	mContentContext->SetCurrentFontSize(mOptions.fontSize);
	mContentContext->Tj(mText);
	mContentContext->ET();	

	if(inComputeAdvance) {
		UIntList glyphs;

		GlyphUnicodeMappingList::iterator it = mText.begin();
		for(;it!=mText.end(); ++it) {
			glyphs.push_back(it->mGlyphCode);
		}
		
		mLatestAdvance = mContentContext->GetCurrentFont()->CalculateTextAdvance(glyphs, mOptions.fontSize);
	}

	mText.clear();
}